

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape::compute_integral_of_landscape
          (Persistence_landscape *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_type local_28;
  size_t nr;
  size_t i;
  double result;
  Persistence_landscape *this_local;
  
  i = 0;
  nr = 0;
  while( true ) {
    sVar4 = std::
            vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ::size(&this->land);
    if (nr == sVar4) break;
    local_28 = 2;
    while( true ) {
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,nr);
      sVar4 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(pvVar5);
      if (local_28 == sVar4 - 1) break;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,nr);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28);
      dVar1 = pvVar6->first;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,nr);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28 - 1);
      dVar2 = pvVar6->first;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,nr);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28);
      dVar3 = pvVar6->second;
      pvVar5 = std::
               vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
               ::operator[](&this->land,nr);
      pvVar6 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](pvVar5,local_28 - 1);
      i = (size_t)((dVar1 - dVar2) * 0.5 * (dVar3 + pvVar6->second) + (double)i);
      local_28 = local_28 + 1;
    }
    nr = nr + 1;
  }
  return (double)i;
}

Assistant:

double Persistence_landscape::compute_integral_of_landscape() const {
  double result = 0;
  for (size_t i = 0; i != this->land.size(); ++i) {
    for (size_t nr = 2; nr != this->land[i].size() - 1; ++nr) {
      // it suffices to compute every planar integral and then sum them up for each lambda_n
      result += 0.5 * (this->land[i][nr].first - this->land[i][nr - 1].first) *
                (this->land[i][nr].second + this->land[i][nr - 1].second);
    }
  }
  return result;
}